

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_xml_generator.cc
# Opt level: O1

void __thiscall t_xml_generator::write_type(t_xml_generator *this,t_type *ttype)

{
  t_type *ptVar1;
  pointer pcVar2;
  long lVar3;
  int iVar4;
  undefined4 extraout_var;
  string type;
  string local_180;
  string local_160;
  string local_140;
  string local_120;
  string local_100;
  string local_e0;
  string local_c0;
  string local_a0;
  string local_80;
  string local_60;
  string local_40;
  
  get_type_name_abi_cxx11_(&local_180,(t_xml_generator *)ttype,ttype);
  local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"type","");
  local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_60,local_180._M_dataplus._M_p,
             local_180._M_dataplus._M_p + local_180._M_string_length);
  write_attribute(this,&local_40,&local_60);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60._M_dataplus._M_p != &local_60.field_2) {
    operator_delete(local_60._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p);
  }
  iVar4 = std::__cxx11::string::compare((char *)&local_180);
  if (iVar4 == 0) {
    local_80._M_dataplus._M_p = (pointer)&local_80.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_80,"type-module","");
    pcVar2 = (ttype->program_->name_)._M_dataplus._M_p;
    local_a0._M_dataplus._M_p = (pointer)&local_a0.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_a0,pcVar2,pcVar2 + (ttype->program_->name_)._M_string_length);
    write_attribute(this,&local_80,&local_a0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
      operator_delete(local_a0._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_80._M_dataplus._M_p != &local_80.field_2) {
      operator_delete(local_80._M_dataplus._M_p);
    }
    local_c0._M_dataplus._M_p = (pointer)&local_c0.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_c0,"type-id","");
    iVar4 = (*(ttype->super_t_doc)._vptr_t_doc[3])(ttype);
    lVar3 = *(long *)CONCAT44(extraout_var,iVar4);
    local_e0._M_dataplus._M_p = (pointer)&local_e0.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_e0,lVar3,((long *)CONCAT44(extraout_var,iVar4))[1] + lVar3);
    write_attribute(this,&local_c0,&local_e0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_e0._M_dataplus._M_p != &local_e0.field_2) {
      operator_delete(local_e0._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
      operator_delete(local_c0._M_dataplus._M_p);
    }
  }
  else {
    iVar4 = std::__cxx11::string::compare((char *)&local_180);
    if (iVar4 == 0) {
      ptVar1 = *(t_type **)&ttype[1].super_t_doc.has_doc_;
      local_100._M_dataplus._M_p = (pointer)&local_100.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_100,"elemType","");
      write_element_start(this,&local_100);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_100._M_dataplus._M_p != &local_100.field_2) {
        operator_delete(local_100._M_dataplus._M_p);
      }
      write_type(this,ptVar1);
      write_element_end(this);
    }
    else {
      iVar4 = std::__cxx11::string::compare((char *)&local_180);
      if (iVar4 == 0) {
        ptVar1 = *(t_type **)&ttype[1].super_t_doc.has_doc_;
        local_120._M_dataplus._M_p = (pointer)&local_120.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_120,"elemType","");
        write_element_start(this,&local_120);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_120._M_dataplus._M_p != &local_120.field_2) {
          operator_delete(local_120._M_dataplus._M_p);
        }
        write_type(this,ptVar1);
        write_element_end(this);
      }
      else {
        iVar4 = std::__cxx11::string::compare((char *)&local_180);
        if (iVar4 == 0) {
          ptVar1 = *(t_type **)&ttype[1].super_t_doc.has_doc_;
          local_140._M_dataplus._M_p = (pointer)&local_140.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_140,"keyType","");
          write_element_start(this,&local_140);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_140._M_dataplus._M_p != &local_140.field_2) {
            operator_delete(local_140._M_dataplus._M_p);
          }
          write_type(this,ptVar1);
          write_element_end(this);
          ptVar1 = *(t_type **)&ttype[1].annotations_._M_t._M_impl;
          local_160._M_dataplus._M_p = (pointer)&local_160.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_160,"valueType","");
          write_element_start(this,&local_160);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_160._M_dataplus._M_p != &local_160.field_2) {
            operator_delete(local_160._M_dataplus._M_p);
          }
          write_type(this,ptVar1);
          write_element_end(this);
        }
      }
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_180._M_dataplus._M_p != &local_180.field_2) {
    operator_delete(local_180._M_dataplus._M_p);
  }
  return;
}

Assistant:

void t_xml_generator::write_type(t_type* ttype) {
  const string type = get_type_name(ttype);
  write_attribute("type", type);
  if (type == "id") {
    write_attribute("type-module", ttype->get_program()->get_name());
    write_attribute("type-id", ttype->get_name());
  } else if (type == "list") {
    t_type* etype = ((t_list*)ttype)->get_elem_type();
    write_element_start("elemType");
    write_type(etype);
    write_element_end();
  } else if (type == "set") {
    t_type* etype = ((t_set*)ttype)->get_elem_type();
    write_element_start("elemType");
    write_type(etype);
    write_element_end();
  } else if (type == "map") {
    t_type* ktype = ((t_map*)ttype)->get_key_type();
    write_element_start("keyType");
    write_type(ktype);
    write_element_end();
    t_type* vtype = ((t_map*)ttype)->get_val_type();
    write_element_start("valueType");
    write_type(vtype);
    write_element_end();
  }
}